

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::ShaderAtomicAndCase::ShaderAtomicAndCase
          (ShaderAtomicAndCase *this,Context *context,char *name,AtomicOperandType operandType,
          DataType type,Precision precision)

{
  Precision PVar1;
  sbyte sVar2;
  uint uVar3;
  UVec3 local_14;
  
  local_14.m_data[0] = 3;
  local_14.m_data[1] = 2;
  local_14.m_data[2] = 1;
  ShaderAtomicOpCase::ShaderAtomicOpCase
            (&this->super_ShaderAtomicOpCase,context,name,"atomicAnd",operandType,type,precision,
             &local_14);
  PVar1 = (this->super_ShaderAtomicOpCase).m_precision;
  sVar2 = 0;
  if (PVar1 != PRECISION_HIGHP) {
    sVar2 = (PVar1 == PRECISION_MEDIUMP) * '\b' + 8;
  }
  (this->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderAtomicOpCase_00b49fb0;
  uVar3 = ~(-1 << sVar2);
  if (PVar1 == PRECISION_HIGHP) {
    uVar3 = 0xffffffff;
  }
  (this->super_ShaderAtomicOpCase).m_initialValue =
       (1 << ((byte)(sVar2 - 1) & 0x1f) ^ 0xfffffffeU) & uVar3;
  return;
}

Assistant:

ShaderAtomicAndCase (Context& context, const char* name, AtomicOperandType operandType, DataType type, Precision precision)
		: ShaderAtomicOpCase(context, name, "atomicAnd", operandType, type, precision, UVec3(3,2,1))
	{
		const int		numBits		= m_precision == PRECISION_HIGHP ? 32 :
									  m_precision == PRECISION_MEDIUMP ? 16 : 8;
		const deUint32	valueMask	= numBits == 32 ? ~0u : (1u<<numBits)-1u;
		m_initialValue = ~((1u<<(numBits-1u)) | 1u) & valueMask; // All bits except lowest and highest set.
	}